

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yl_opt.c
# Opt level: O1

int yl_opt_update_schema_out_format(char *arg,yl_opt *yo)

{
  int iVar1;
  LYS_OUTFORMAT LVar2;
  
  iVar1 = strcasecmp(arg,"yang");
  if (iVar1 == 0) {
    LVar2 = LYS_OUT_YANG;
  }
  else {
    iVar1 = strcasecmp(arg,"yin");
    if (iVar1 == 0) {
      LVar2 = LYS_OUT_YIN;
    }
    else {
      iVar1 = strcasecmp(arg,"info");
      if (iVar1 == 0) {
        LVar2 = LYS_OUT_YANG_COMPILED;
      }
      else {
        iVar1 = strcasecmp(arg,"tree");
        if (iVar1 != 0) {
          return 1;
        }
        LVar2 = LYS_OUT_TREE;
      }
    }
  }
  yo->schema_out_format = LVar2;
  yo->data_out_format = LYD_UNKNOWN;
  return 0;
}

Assistant:

int
yl_opt_update_schema_out_format(const char *arg, struct yl_opt *yo)
{
    if (!strcasecmp(arg, "yang")) {
        yo->schema_out_format = LYS_OUT_YANG;
        yo->data_out_format = 0;
    } else if (!strcasecmp(arg, "yin")) {
        yo->schema_out_format = LYS_OUT_YIN;
        yo->data_out_format = 0;
    } else if (!strcasecmp(arg, "info")) {
        yo->schema_out_format = LYS_OUT_YANG_COMPILED;
        yo->data_out_format = 0;
    } else if (!strcasecmp(arg, "tree")) {
        yo->schema_out_format = LYS_OUT_TREE;
        yo->data_out_format = 0;
    } else {
        return 1;
    }

    return 0;
}